

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O0

argparse_result_t argparse_cbk(char *short_name,char *long_name,char *value)

{
  adt_str_t *paVar1;
  adt_str_t *paVar2;
  int iVar3;
  long lVar4;
  adt_str_t *paVar5;
  adt_str_t *tmp;
  long lval_1;
  char *end_1;
  long lval;
  char *end;
  char *value_local;
  char *long_name_local;
  char *short_name_local;
  
  end = value;
  value_local = long_name;
  long_name_local = short_name;
  if (value == (char *)0x0) {
    if (short_name != (char *)0x0) {
      iVar3 = strcmp(short_name,"i");
      if (((iVar3 != 0) && (iVar3 = strcmp(long_name_local,"p"), iVar3 != 0)) &&
         (iVar3 = strcmp(long_name_local,"c"), iVar3 != 0)) {
        iVar3 = strcmp(long_name_local,"h");
        if (iVar3 == 0) {
          m_display_help = true;
          return ARGPARSE_SUCCESS;
        }
        return ARGPARSE_NAME_ERROR;
      }
      return ARGPARSE_NEED_VALUE;
    }
    if (long_name != (char *)0x0) {
      iVar3 = strcmp(long_name,"connect");
      if ((iVar3 == 0) || (iVar3 = strcmp(value_local,"port"), iVar3 == 0)) {
        return ARGPARSE_NEED_VALUE;
      }
      iVar3 = strcmp(value_local,"help");
      if (iVar3 == 0) {
        m_display_help = true;
        return ARGPARSE_SUCCESS;
      }
      iVar3 = strcmp(value_local,"version");
      if (iVar3 == 0) {
        m_display_version = true;
        return ARGPARSE_SUCCESS;
      }
      return ARGPARSE_NAME_ERROR;
    }
  }
  else if (short_name == (char *)0x0) {
    if (long_name == (char *)0x0) {
      paVar5 = (adt_str_t *)adt_str_new_cstr(value);
      if (paVar5 == (adt_str_t *)0x0) {
        return ARGPARSE_MEM_ERROR;
      }
      paVar1 = paVar5;
      paVar2 = m_value;
      if ((m_pos_arg_count != 0) && (paVar1 = m_name, paVar2 = paVar5, m_pos_arg_count != 1)) {
        adt_str_delete(paVar5);
        return ARGPARSE_PARSE_ERROR;
      }
      m_value = paVar2;
      m_name = paVar1;
      m_pos_arg_count = m_pos_arg_count + 1;
    }
    else {
      iVar3 = strcmp(long_name,"port");
      if (iVar3 == 0) {
        lVar4 = strtol(end,(char **)&lval_1,0);
        if (((ulong)lval_1 <= end) || (0xffff < lVar4)) {
          return ARGPARSE_VALUE_ERROR;
        }
        m_connect_port = (uint16_t)lVar4;
      }
      else {
        iVar3 = strcmp(value_local,"connect");
        if (iVar3 == 0) {
          if (m_connect_address != (adt_str_t *)0x0) {
            adt_str_delete(m_connect_address);
          }
          m_connect_resource_type = apx_parse_resource_name(end,&m_connect_address,&m_connect_port);
          if ((m_connect_resource_type == '\0') || (m_connect_resource_type == '\x05')) {
            return ARGPARSE_VALUE_ERROR;
          }
        }
      }
    }
  }
  else {
    iVar3 = strcmp(short_name,"p");
    if (iVar3 == 0) {
      lVar4 = strtol(end,(char **)&lval,0);
      if (((ulong)lval <= end) || (0xffff < lVar4)) {
        return ARGPARSE_VALUE_ERROR;
      }
      m_connect_port = (uint16_t)lVar4;
    }
    else {
      iVar3 = strcmp(long_name_local,"c");
      if (iVar3 == 0) {
        if (m_connect_address != (adt_str_t *)0x0) {
          adt_str_delete(m_connect_address);
        }
        m_connect_resource_type = apx_parse_resource_name(end,&m_connect_address,&m_connect_port);
        if ((m_connect_resource_type == '\0') || (m_connect_resource_type == '\x05')) {
          return ARGPARSE_VALUE_ERROR;
        }
      }
      else {
        iVar3 = strcmp(long_name_local,"i");
        if (iVar3 != 0) {
          return ARGPARSE_PARSE_ERROR;
        }
        m_input_file_path = (adt_str_t *)adt_str_new_cstr(end);
        if (m_input_file_path == (adt_str_t *)0x0) {
          return ARGPARSE_MEM_ERROR;
        }
      }
    }
  }
  return ARGPARSE_SUCCESS;
}

Assistant:

static argparse_result_t argparse_cbk(const char *short_name, const char *long_name, const char *value)
{
   if (value == 0)
   {
      if ( short_name != 0 )
      {
         if ( (strcmp(short_name,"i")==0) || (strcmp(short_name,"p")==0) ||
              (strcmp(short_name,"c")==0) )
         {
            return ARGPARSE_NEED_VALUE;
         }
         else if( (strcmp(short_name,"h")==0) )
         {
            m_display_help = true;
            return ARGPARSE_SUCCESS;
         }
         else
         {
            return ARGPARSE_NAME_ERROR;
         }
      }
      else if ( (long_name != 0) )
      {
         if ( (strcmp(long_name,"connect")==0) || (strcmp(long_name,"port")==0) )
         {
            return ARGPARSE_NEED_VALUE;
         }
         else if ( (strcmp(long_name,"help")==0) )
         {
            m_display_help = true;
            return ARGPARSE_SUCCESS;
         }
         else if ( (strcmp(long_name,"version")==0) )
         {
            m_display_version = true;
            return ARGPARSE_SUCCESS;
         }
         else
         {
            return ARGPARSE_NAME_ERROR;
         }
      }
   }
   else
   {
      if ( short_name != 0 )
      {
         char *end;
         long lval;
         if (strcmp(short_name,"p")==0)
         {
            lval = strtol(value, &end, 0);
            if ((end > value) && (lval <= UINT16_MAX))
            {
               m_connect_port = (uint16_t) lval;
            }
            else
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(short_name,"c")==0)
         {
            if (m_connect_address != 0) adt_str_delete(m_connect_address);
            m_connect_resource_type = apx_parse_resource_name(value, &m_connect_address, &m_connect_port);
            if ( (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN) ||
                 (m_connect_resource_type == APX_RESOURCE_TYPE_ERROR))
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(short_name, "i") == 0)
         {
            m_input_file_path = adt_str_new_cstr(value);
            if (m_input_file_path == 0)
            {
               return ARGPARSE_MEM_ERROR;
            }
         }
         else
         {
            return ARGPARSE_PARSE_ERROR;
         }
      }
      else if (long_name != 0)
      {
         char *end;
         long lval;
         if (strcmp(long_name,"port")==0)
         {
            lval = strtol(value, &end, 0);
            if ( (end > value) && (lval <= UINT16_MAX))
            {
               m_connect_port = (uint16_t) lval;
            }
            else
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
         else if (strcmp(long_name,"connect")==0)
         {
            if (m_connect_address != 0) adt_str_delete(m_connect_address);
            m_connect_resource_type = apx_parse_resource_name(value, &m_connect_address, &m_connect_port);
            if ( (m_connect_resource_type == APX_RESOURCE_TYPE_UNKNOWN) ||
                 (m_connect_resource_type == APX_RESOURCE_TYPE_ERROR))
            {
               return ARGPARSE_VALUE_ERROR;
            }
         }
      }
      else
      {
         adt_str_t *tmp = adt_str_new_cstr(value);
         if (tmp == 0)
         {
            return ARGPARSE_MEM_ERROR;
         }
         if (m_pos_arg_count==0u)
         {
            m_name = tmp;
         }
         else if (m_pos_arg_count==1u)
         {
            m_value = tmp;
         }
         else
         {
            adt_str_delete(tmp);
            return ARGPARSE_PARSE_ERROR;
         }
         m_pos_arg_count++;
      }
   }
   return ARGPARSE_SUCCESS;
}